

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d44ed::QPDFWordTokenFinder::~QPDFWordTokenFinder(QPDFWordTokenFinder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Finder)._vptr_Finder = (_func_int **)&PTR__QPDFWordTokenFinder_002ef160;
  pcVar2 = (this->str)._M_dataplus._M_p;
  paVar1 = &(this->str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~QPDFWordTokenFinder() override = default;